

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O1

void __thiscall MT32Emu::DefaultMidiStreamParser::handleSysex(DefaultMidiStreamParser *this)

{
  Bit32u in_EDX;
  Bit8u *in_RSI;
  
  handleSysex((DefaultMidiStreamParser *)
              &this[-1].super_MidiStreamParser.super_MidiStreamParserImpl.midiReceiver,in_RSI,in_EDX
             );
  return;
}

Assistant:

void DefaultMidiStreamParser::handleSysex(const Bit8u *stream, const Bit32u length) {
	do {
		if (timestampSet) {
			if (synth.playSysex(stream, length, timestamp)) return;
		}
		else {
			if (synth.playSysex(stream, length)) return;
		}
	} while (synth.reportHandler->onMIDIQueueOverflow());
}